

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O2

mp_int * probprime_generate(PrimeGenerationContext *ctx,PrimeCandidateSource *pcs,
                           ProgressReceiver *prog)

{
  _Bool _Var1;
  uint uVar2;
  mp_int *p;
  MillerRabin *mr;
  size_t sVar3;
  int iVar4;
  
  pcs_ready(pcs);
  do {
    (*prog->vt->report_attempt)(prog);
    p = pcs_generate(pcs);
    if (p == (mp_int *)0x0) {
LAB_0012c405:
      pcs_free(pcs);
      return p;
    }
    mr = miller_rabin_new(p);
    sVar3 = mp_get_nbits(p);
    uVar2 = miller_rabin_checks_needed((uint)sVar3);
    iVar4 = uVar2 + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        miller_rabin_free(mr);
        goto LAB_0012c405;
      }
      _Var1 = miller_rabin_test_random(mr);
    } while (_Var1);
    miller_rabin_free(mr);
    mp_free(p);
  } while( true );
}

Assistant:

static mp_int *probprime_generate(
    PrimeGenerationContext *ctx,
    PrimeCandidateSource *pcs, ProgressReceiver *prog)
{
    pcs_ready(pcs);

    while (true) {
        progress_report_attempt(prog);

        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        MillerRabin *mr = miller_rabin_new(p);
        bool known_bad = false;
        unsigned nchecks = miller_rabin_checks_needed(mp_get_nbits(p));
        for (unsigned check = 0; check < nchecks; check++) {
            if (!miller_rabin_test_random(mr)) {
                known_bad = true;
                break;
            }
        }
        miller_rabin_free(mr);

        if (!known_bad) {
            /*
             * We have a prime!
             */
            pcs_free(pcs);
            return p;
        }

        mp_free(p);
    }
}